

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall test_ethash_dir_creation::test_method(test_ethash_dir_creation *this)

{
  FILE *f;
  ethash_io_rc local_184;
  FILE *local_180;
  undefined **local_178;
  char *local_170;
  shared_count sStack_168;
  char *local_160;
  undefined8 **local_158;
  undefined1 local_150;
  undefined8 *local_148;
  undefined ***local_140;
  char *local_138;
  char *local_130;
  shared_count sStack_128;
  ethash_io_rc local_11c;
  path local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ethash_io_rc *local_d0;
  ethash_io_rc *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_180 = (FILE *)0x0;
  local_50 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0xdd);
  local_170 = (char *)((ulong)local_170 & 0xffffffffffffff00);
  local_178 = &PTR__lazy_ostream_0013ea10;
  sStack_168.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_184 = ETHASH_IO_MEMO_MISMATCH;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_11c = ethash_io_prepare("./test_ethash_directory/",(ethash_h256_t)ZEXT1632(ZEXT816(0)),
                                (FILE **)&local_180,0x40,false);
  local_d0 = &local_11c;
  local_c8 = &local_184;
  local_138 = (char *)CONCAT71(local_138._1_7_,local_184 == local_11c);
  local_130 = (char *)0x0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_38 = "";
  local_140 = (undefined ***)&local_c8;
  local_150 = 0;
  local_158 = (undefined8 **)&PTR__lazy_ostream_0013f0d0;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_118.m_pathname.field_2._8_8_ = &local_d0;
  local_118.m_pathname._M_string_length = local_118.m_pathname._M_string_length & 0xffffffffffffff00
  ;
  local_118.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013f0d0;
  local_118.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_178,&local_40,0xdd,2,2,2,"ETHASH_IO_MEMO_MISMATCH",&local_158,
             "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 64, false)",&local_118);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_70 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xde);
  local_118.m_pathname._M_dataplus._M_p._0_1_ = local_180 != (FILE *)0x0;
  local_118.m_pathname._M_string_length = 0;
  local_118.m_pathname.field_2._M_allocated_capacity = 0;
  local_178 = (undefined **)0x12d53a;
  local_170 = "";
  local_150 = 0;
  local_158 = (undefined8 **)&PTR__lazy_ostream_0013f110;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_140 = &local_178;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_118.m_pathname.field_2._M_allocated_capacity);
  local_a0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xe1);
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"./test_ethash_directory/","");
  boost::filesystem::detail::status(&local_118,(error_code *)&local_158);
  local_178 = (undefined **)
              CONCAT71(local_178._1_7_,(int)local_118.m_pathname._M_dataplus._M_p == 3);
  local_170 = (char *)0x0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_138 = "fs::is_directory(fs::path(\"./test_ethash_directory/\"))";
  local_130 = "";
  local_118.m_pathname._M_string_length = local_118.m_pathname._M_string_length & 0xffffffffffffff00
  ;
  local_118.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013f110;
  local_118.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_118.m_pathname.field_2._8_8_ = &local_138;
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  fclose(local_180);
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"./test_ethash_directory/","");
  boost::filesystem::detail::remove_all((path *)&local_158,(error_code *)0x0);
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_dir_creation) {
	ethash_h256_t seedhash;
	FILE *f = NULL;
	memset(&seedhash, 0, 32);
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 64, false)
	);
	BOOST_REQUIRE(f);

	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));

	// cleanup
	fclose(f);
	fs::remove_all("./test_ethash_directory/");
}